

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateFunctionMapFactory.cpp
# Opt level: O1

ElementFunctionMap *
COLLADASaxFWL15::FunctionMapFactory::createFunctionMap__library_cameras__allChildren(void)

{
  mapped_type *pmVar1;
  
  if (createFunctionMap__library_cameras__allChildren()::functionMap == '\0') {
    createFunctionMap__library_cameras__allChildren();
  }
  if (createFunctionMap__library_cameras__allChildren()::mapFilled == '\0') {
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_COLLADA);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__COLLADA;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__COLLADA;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__COLLADA;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__COLLADA;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__COLLADA;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__COLLADA;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_CAMERAS);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_cameras;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_cameras;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_cameras;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__library_cameras;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_cameras;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__library_cameras;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_ASSET);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__asset;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__asset;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__asset;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__asset;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__asset;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_CAMERA);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__camera;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__camera;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__camera;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__camera;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__camera;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__camera;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_CONTRIBUTOR);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__contributor;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__contributor;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__contributor;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__contributor;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__contributor;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__contributor;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_COVERAGE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__coverage
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__coverage;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__coverage;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__coverage;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__coverage;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__coverage;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_CREATED);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__created;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__created;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__created;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__created;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__created;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__created;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_KEYWORDS);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__keywords
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__keywords;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__keywords;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__keywords;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__keywords;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__keywords;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_MODIFIED);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__modified
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__modified;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__modified;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__modified;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__modified;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__modified;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_REVISION);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__revision
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__revision;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__revision;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__revision;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__revision;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__revision;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_SUBJECT);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__subject;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__subject;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__subject;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__subject;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__subject;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__subject;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_TITLE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__title;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__title;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__title;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__title;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__title;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__title;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_UNIT);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__unit;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__unit;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__unit;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__unit;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__unit;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__unit;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_UP_AXIS);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__up_axis;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__up_axis;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__up_axis;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__up_axis;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__up_axis;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__up_axis;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHOR);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__author;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__author;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__author;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__author;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__author;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__author;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHOR_EMAIL);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__author_email;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__author_email;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__author_email;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__author_email;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__author_email;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__author_email;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHOR_WEBSITE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__author_website;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__author_website;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__author_website
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__author_website;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__author_website;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__author_website;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHORING_TOOL);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__authoring_tool;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__authoring_tool;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__authoring_tool
    ;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__authoring_tool;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__authoring_tool;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__authoring_tool;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_COMMENTS);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__comments
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__comments;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__comments;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__comments;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__comments;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__comments;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_COPYRIGHT);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__copyright;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__copyright;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__copyright;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__copyright;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__copyright;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__copyright;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE_DATA);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__source_data;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__source_data;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__source_data;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__source_data;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__source_data;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__source_data;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_GEOGRAPHIC_LOCATION);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__geographic_location;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__geographic_location;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__geographic_location;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__geographic_location;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__geographic_location;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__geographic_location;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_ALTITUDE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__altitude
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__altitude;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__altitude;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__altitude;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__altitude;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__altitude;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_LATITUDE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__latitude
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__latitude;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__latitude;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__latitude;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__latitude;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__latitude;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_LONGITUDE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__longitude;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__longitude;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__longitude;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__longitude;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__longitude;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__longitude;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_ASSET);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__asset;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__asset;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__asset;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__asset;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__asset;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__technique____technique_type
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_KEYWORDS);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__keywords
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__keywords;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__keywords;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__keywords;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__keywords;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__keywords;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_MODIFIED);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__modified
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__modified;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__modified;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__modified;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__modified;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__modified;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_REVISION);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__revision
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__revision;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__revision;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__revision;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__revision;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__revision;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_SUBJECT);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__subject;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__subject;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__subject;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__subject;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__subject;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__subject;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_TITLE);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__title;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__title;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__title;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__title;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__title;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__title;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_UNIT);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__unit;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__unit;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__unit;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__unit;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__unit;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__unit;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_UP_AXIS);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__up_axis;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__up_axis;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__up_axis;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__up_axis;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__up_axis;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__up_axis;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_ASSET);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__asset;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__asset;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__asset;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__asset;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__asset;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_IMAGER);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__imager;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__imager;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__imager;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__imager;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__imager;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__imager;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_OPTICS);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__optics;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__optics;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__optics;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__optics;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__optics;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__optics;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__technique____technique_type
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__technique____technique_type
    ;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_OPTICS__TECHNIQUE_COMMON);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__optics__technique_common;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__optics__technique_common;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__optics__technique_common;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__optics__technique_common;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__optics__technique_common;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__optics__technique_common;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_ORTHOGRAPHIC);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__orthographic;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__orthographic;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__orthographic;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__orthographic;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__orthographic;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__orthographic;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_PERSPECTIVE);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__perspective;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__perspective;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__perspective;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__perspective;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__perspective;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__perspective;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_ASPECT_RATIO);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__aspect_ratio;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__aspect_ratio;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__aspect_ratio;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__aspect_ratio;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__aspect_ratio;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__aspect_ratio;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_XMAG);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__xmag;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__xmag;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__xmag;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__xmag;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__xmag;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__xmag;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_YMAG);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__ymag;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__ymag;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__ymag;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__ymag;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__ymag;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__ymag;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_ZFAR);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__zfar;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__zfar;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__zfar;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__zfar;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__zfar;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__zfar;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_ZNEAR);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__znear;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__znear;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__znear;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__znear;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__znear;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__znear;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_ASPECT_RATIO);
    pmVar1->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__aspect_ratio;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__aspect_ratio;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__aspect_ratio;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__aspect_ratio;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__aspect_ratio;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__aspect_ratio;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_XFOV);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__xfov;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__xfov;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__xfov;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__xfov;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__xfov;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__xfov;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_YFOV);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__yfov;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__yfov;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__yfov;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__yfov;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__yfov;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__yfov;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_ZFAR);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__zfar;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__zfar;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__zfar;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__zfar;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__zfar;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__zfar;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    pmVar1 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_cameras__allChildren::functionMap,
                          &HASH_ELEMENT_ZNEAR);
    pmVar1->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__znear;
    *(undefined8 *)&pmVar1->field_0x8 = 0;
    pmVar1->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__znear;
    *(undefined8 *)&pmVar1->field_0x18 = 0;
    pmVar1->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__znear;
    *(undefined8 *)&pmVar1->field_0x28 = 0;
    pmVar1->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__znear;
    *(undefined8 *)&pmVar1->field_0x38 = 0;
    pmVar1->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__znear;
    *(undefined8 *)&pmVar1->field_0x48 = 0;
    pmVar1->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__znear;
    *(undefined8 *)&pmVar1->field_0x58 = 0;
    createFunctionMap__library_cameras__allChildren()::mapFilled = '\x01';
  }
  return &createFunctionMap__library_cameras__allChildren::functionMap;
}

Assistant:

const ColladaParserAutoGen15Private::ElementFunctionMap& FunctionMapFactory::createFunctionMap__library_cameras__allChildren() {
static ColladaParserAutoGen15Private::ElementFunctionMap functionMap;
static bool mapFilled = false;
if ( !mapFilled )
{
functionMap[HASH_ELEMENT_COLLADA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__COLLADA, &ColladaParserAutoGen15Private::_data__COLLADA, &ColladaParserAutoGen15Private::_end__COLLADA, &ColladaParserAutoGen15Private::_preBegin__COLLADA, &ColladaParserAutoGen15Private::_preEnd__COLLADA, &ColladaParserAutoGen15Private::_freeAttributes__COLLADA);
functionMap[HASH_ELEMENT_LIBRARY_CAMERAS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_cameras, &ColladaParserAutoGen15Private::_data__library_cameras, &ColladaParserAutoGen15Private::_end__library_cameras, &ColladaParserAutoGen15Private::_preBegin__library_cameras, &ColladaParserAutoGen15Private::_preEnd__library_cameras, &ColladaParserAutoGen15Private::_freeAttributes__library_cameras);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_CAMERA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__camera, &ColladaParserAutoGen15Private::_data__camera, &ColladaParserAutoGen15Private::_end__camera, &ColladaParserAutoGen15Private::_preBegin__camera, &ColladaParserAutoGen15Private::_preEnd__camera, &ColladaParserAutoGen15Private::_freeAttributes__camera);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_CONTRIBUTOR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__contributor, &ColladaParserAutoGen15Private::_data__contributor, &ColladaParserAutoGen15Private::_end__contributor, &ColladaParserAutoGen15Private::_preBegin__contributor, &ColladaParserAutoGen15Private::_preEnd__contributor, &ColladaParserAutoGen15Private::_freeAttributes__contributor);
functionMap[HASH_ELEMENT_COVERAGE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__coverage, &ColladaParserAutoGen15Private::_data__coverage, &ColladaParserAutoGen15Private::_end__coverage, &ColladaParserAutoGen15Private::_preBegin__coverage, &ColladaParserAutoGen15Private::_preEnd__coverage, &ColladaParserAutoGen15Private::_freeAttributes__coverage);
functionMap[HASH_ELEMENT_CREATED] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__created, &ColladaParserAutoGen15Private::_data__created, &ColladaParserAutoGen15Private::_end__created, &ColladaParserAutoGen15Private::_preBegin__created, &ColladaParserAutoGen15Private::_preEnd__created, &ColladaParserAutoGen15Private::_freeAttributes__created);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_KEYWORDS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__keywords, &ColladaParserAutoGen15Private::_data__keywords, &ColladaParserAutoGen15Private::_end__keywords, &ColladaParserAutoGen15Private::_preBegin__keywords, &ColladaParserAutoGen15Private::_preEnd__keywords, &ColladaParserAutoGen15Private::_freeAttributes__keywords);
functionMap[HASH_ELEMENT_MODIFIED] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__modified, &ColladaParserAutoGen15Private::_data__modified, &ColladaParserAutoGen15Private::_end__modified, &ColladaParserAutoGen15Private::_preBegin__modified, &ColladaParserAutoGen15Private::_preEnd__modified, &ColladaParserAutoGen15Private::_freeAttributes__modified);
functionMap[HASH_ELEMENT_REVISION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__revision, &ColladaParserAutoGen15Private::_data__revision, &ColladaParserAutoGen15Private::_end__revision, &ColladaParserAutoGen15Private::_preBegin__revision, &ColladaParserAutoGen15Private::_preEnd__revision, &ColladaParserAutoGen15Private::_freeAttributes__revision);
functionMap[HASH_ELEMENT_SUBJECT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__subject, &ColladaParserAutoGen15Private::_data__subject, &ColladaParserAutoGen15Private::_end__subject, &ColladaParserAutoGen15Private::_preBegin__subject, &ColladaParserAutoGen15Private::_preEnd__subject, &ColladaParserAutoGen15Private::_freeAttributes__subject);
functionMap[HASH_ELEMENT_TITLE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__title, &ColladaParserAutoGen15Private::_data__title, &ColladaParserAutoGen15Private::_end__title, &ColladaParserAutoGen15Private::_preBegin__title, &ColladaParserAutoGen15Private::_preEnd__title, &ColladaParserAutoGen15Private::_freeAttributes__title);
functionMap[HASH_ELEMENT_UNIT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__unit, &ColladaParserAutoGen15Private::_data__unit, &ColladaParserAutoGen15Private::_end__unit, &ColladaParserAutoGen15Private::_preBegin__unit, &ColladaParserAutoGen15Private::_preEnd__unit, &ColladaParserAutoGen15Private::_freeAttributes__unit);
functionMap[HASH_ELEMENT_UP_AXIS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__up_axis, &ColladaParserAutoGen15Private::_data__up_axis, &ColladaParserAutoGen15Private::_end__up_axis, &ColladaParserAutoGen15Private::_preBegin__up_axis, &ColladaParserAutoGen15Private::_preEnd__up_axis, &ColladaParserAutoGen15Private::_freeAttributes__up_axis);
functionMap[HASH_ELEMENT_AUTHOR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__author, &ColladaParserAutoGen15Private::_data__author, &ColladaParserAutoGen15Private::_end__author, &ColladaParserAutoGen15Private::_preBegin__author, &ColladaParserAutoGen15Private::_preEnd__author, &ColladaParserAutoGen15Private::_freeAttributes__author);
functionMap[HASH_ELEMENT_AUTHOR_EMAIL] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__author_email, &ColladaParserAutoGen15Private::_data__author_email, &ColladaParserAutoGen15Private::_end__author_email, &ColladaParserAutoGen15Private::_preBegin__author_email, &ColladaParserAutoGen15Private::_preEnd__author_email, &ColladaParserAutoGen15Private::_freeAttributes__author_email);
functionMap[HASH_ELEMENT_AUTHOR_WEBSITE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__author_website, &ColladaParserAutoGen15Private::_data__author_website, &ColladaParserAutoGen15Private::_end__author_website, &ColladaParserAutoGen15Private::_preBegin__author_website, &ColladaParserAutoGen15Private::_preEnd__author_website, &ColladaParserAutoGen15Private::_freeAttributes__author_website);
functionMap[HASH_ELEMENT_AUTHORING_TOOL] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__authoring_tool, &ColladaParserAutoGen15Private::_data__authoring_tool, &ColladaParserAutoGen15Private::_end__authoring_tool, &ColladaParserAutoGen15Private::_preBegin__authoring_tool, &ColladaParserAutoGen15Private::_preEnd__authoring_tool, &ColladaParserAutoGen15Private::_freeAttributes__authoring_tool);
functionMap[HASH_ELEMENT_COMMENTS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__comments, &ColladaParserAutoGen15Private::_data__comments, &ColladaParserAutoGen15Private::_end__comments, &ColladaParserAutoGen15Private::_preBegin__comments, &ColladaParserAutoGen15Private::_preEnd__comments, &ColladaParserAutoGen15Private::_freeAttributes__comments);
functionMap[HASH_ELEMENT_COPYRIGHT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__copyright, &ColladaParserAutoGen15Private::_data__copyright, &ColladaParserAutoGen15Private::_end__copyright, &ColladaParserAutoGen15Private::_preBegin__copyright, &ColladaParserAutoGen15Private::_preEnd__copyright, &ColladaParserAutoGen15Private::_freeAttributes__copyright);
functionMap[HASH_ELEMENT_SOURCE_DATA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source_data, &ColladaParserAutoGen15Private::_data__source_data, &ColladaParserAutoGen15Private::_end__source_data, &ColladaParserAutoGen15Private::_preBegin__source_data, &ColladaParserAutoGen15Private::_preEnd__source_data, &ColladaParserAutoGen15Private::_freeAttributes__source_data);
functionMap[HASH_ELEMENT_GEOGRAPHIC_LOCATION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__geographic_location, &ColladaParserAutoGen15Private::_data__geographic_location, &ColladaParserAutoGen15Private::_end__geographic_location, &ColladaParserAutoGen15Private::_preBegin__geographic_location, &ColladaParserAutoGen15Private::_preEnd__geographic_location, &ColladaParserAutoGen15Private::_freeAttributes__geographic_location);
functionMap[HASH_ELEMENT_ALTITUDE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__altitude, &ColladaParserAutoGen15Private::_data__altitude, &ColladaParserAutoGen15Private::_end__altitude, &ColladaParserAutoGen15Private::_preBegin__altitude, &ColladaParserAutoGen15Private::_preEnd__altitude, &ColladaParserAutoGen15Private::_freeAttributes__altitude);
functionMap[HASH_ELEMENT_LATITUDE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__latitude, &ColladaParserAutoGen15Private::_data__latitude, &ColladaParserAutoGen15Private::_end__latitude, &ColladaParserAutoGen15Private::_preBegin__latitude, &ColladaParserAutoGen15Private::_preEnd__latitude, &ColladaParserAutoGen15Private::_freeAttributes__latitude);
functionMap[HASH_ELEMENT_LONGITUDE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__longitude, &ColladaParserAutoGen15Private::_data__longitude, &ColladaParserAutoGen15Private::_end__longitude, &ColladaParserAutoGen15Private::_preBegin__longitude, &ColladaParserAutoGen15Private::_preEnd__longitude, &ColladaParserAutoGen15Private::_freeAttributes__longitude);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__technique____technique_type, &ColladaParserAutoGen15Private::_data__technique____technique_type, &ColladaParserAutoGen15Private::_end__technique____technique_type, &ColladaParserAutoGen15Private::_preBegin__technique____technique_type, &ColladaParserAutoGen15Private::_preEnd__technique____technique_type, &ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type);
functionMap[HASH_ELEMENT_KEYWORDS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__keywords, &ColladaParserAutoGen15Private::_data__keywords, &ColladaParserAutoGen15Private::_end__keywords, &ColladaParserAutoGen15Private::_preBegin__keywords, &ColladaParserAutoGen15Private::_preEnd__keywords, &ColladaParserAutoGen15Private::_freeAttributes__keywords);
functionMap[HASH_ELEMENT_MODIFIED] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__modified, &ColladaParserAutoGen15Private::_data__modified, &ColladaParserAutoGen15Private::_end__modified, &ColladaParserAutoGen15Private::_preBegin__modified, &ColladaParserAutoGen15Private::_preEnd__modified, &ColladaParserAutoGen15Private::_freeAttributes__modified);
functionMap[HASH_ELEMENT_REVISION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__revision, &ColladaParserAutoGen15Private::_data__revision, &ColladaParserAutoGen15Private::_end__revision, &ColladaParserAutoGen15Private::_preBegin__revision, &ColladaParserAutoGen15Private::_preEnd__revision, &ColladaParserAutoGen15Private::_freeAttributes__revision);
functionMap[HASH_ELEMENT_SUBJECT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__subject, &ColladaParserAutoGen15Private::_data__subject, &ColladaParserAutoGen15Private::_end__subject, &ColladaParserAutoGen15Private::_preBegin__subject, &ColladaParserAutoGen15Private::_preEnd__subject, &ColladaParserAutoGen15Private::_freeAttributes__subject);
functionMap[HASH_ELEMENT_TITLE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__title, &ColladaParserAutoGen15Private::_data__title, &ColladaParserAutoGen15Private::_end__title, &ColladaParserAutoGen15Private::_preBegin__title, &ColladaParserAutoGen15Private::_preEnd__title, &ColladaParserAutoGen15Private::_freeAttributes__title);
functionMap[HASH_ELEMENT_UNIT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__unit, &ColladaParserAutoGen15Private::_data__unit, &ColladaParserAutoGen15Private::_end__unit, &ColladaParserAutoGen15Private::_preBegin__unit, &ColladaParserAutoGen15Private::_preEnd__unit, &ColladaParserAutoGen15Private::_freeAttributes__unit);
functionMap[HASH_ELEMENT_UP_AXIS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__up_axis, &ColladaParserAutoGen15Private::_data__up_axis, &ColladaParserAutoGen15Private::_end__up_axis, &ColladaParserAutoGen15Private::_preBegin__up_axis, &ColladaParserAutoGen15Private::_preEnd__up_axis, &ColladaParserAutoGen15Private::_freeAttributes__up_axis);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_IMAGER] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__imager, &ColladaParserAutoGen15Private::_data__imager, &ColladaParserAutoGen15Private::_end__imager, &ColladaParserAutoGen15Private::_preBegin__imager, &ColladaParserAutoGen15Private::_preEnd__imager, &ColladaParserAutoGen15Private::_freeAttributes__imager);
functionMap[HASH_ELEMENT_OPTICS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__optics, &ColladaParserAutoGen15Private::_data__optics, &ColladaParserAutoGen15Private::_end__optics, &ColladaParserAutoGen15Private::_preBegin__optics, &ColladaParserAutoGen15Private::_preEnd__optics, &ColladaParserAutoGen15Private::_freeAttributes__optics);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__technique____technique_type, &ColladaParserAutoGen15Private::_data__technique____technique_type, &ColladaParserAutoGen15Private::_end__technique____technique_type, &ColladaParserAutoGen15Private::_preBegin__technique____technique_type, &ColladaParserAutoGen15Private::_preEnd__technique____technique_type, &ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__technique____technique_type, &ColladaParserAutoGen15Private::_data__technique____technique_type, &ColladaParserAutoGen15Private::_end__technique____technique_type, &ColladaParserAutoGen15Private::_preBegin__technique____technique_type, &ColladaParserAutoGen15Private::_preEnd__technique____technique_type, &ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type);
functionMap[HASH_ELEMENT_OPTICS__TECHNIQUE_COMMON] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__optics__technique_common, &ColladaParserAutoGen15Private::_data__optics__technique_common, &ColladaParserAutoGen15Private::_end__optics__technique_common, &ColladaParserAutoGen15Private::_preBegin__optics__technique_common, &ColladaParserAutoGen15Private::_preEnd__optics__technique_common, &ColladaParserAutoGen15Private::_freeAttributes__optics__technique_common);
functionMap[HASH_ELEMENT_ORTHOGRAPHIC] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__orthographic, &ColladaParserAutoGen15Private::_data__orthographic, &ColladaParserAutoGen15Private::_end__orthographic, &ColladaParserAutoGen15Private::_preBegin__orthographic, &ColladaParserAutoGen15Private::_preEnd__orthographic, &ColladaParserAutoGen15Private::_freeAttributes__orthographic);
functionMap[HASH_ELEMENT_PERSPECTIVE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__perspective, &ColladaParserAutoGen15Private::_data__perspective, &ColladaParserAutoGen15Private::_end__perspective, &ColladaParserAutoGen15Private::_preBegin__perspective, &ColladaParserAutoGen15Private::_preEnd__perspective, &ColladaParserAutoGen15Private::_freeAttributes__perspective);
functionMap[HASH_ELEMENT_ASPECT_RATIO] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__aspect_ratio, &ColladaParserAutoGen15Private::_data__aspect_ratio, &ColladaParserAutoGen15Private::_end__aspect_ratio, &ColladaParserAutoGen15Private::_preBegin__aspect_ratio, &ColladaParserAutoGen15Private::_preEnd__aspect_ratio, &ColladaParserAutoGen15Private::_freeAttributes__aspect_ratio);
functionMap[HASH_ELEMENT_XMAG] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__xmag, &ColladaParserAutoGen15Private::_data__xmag, &ColladaParserAutoGen15Private::_end__xmag, &ColladaParserAutoGen15Private::_preBegin__xmag, &ColladaParserAutoGen15Private::_preEnd__xmag, &ColladaParserAutoGen15Private::_freeAttributes__xmag);
functionMap[HASH_ELEMENT_YMAG] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__ymag, &ColladaParserAutoGen15Private::_data__ymag, &ColladaParserAutoGen15Private::_end__ymag, &ColladaParserAutoGen15Private::_preBegin__ymag, &ColladaParserAutoGen15Private::_preEnd__ymag, &ColladaParserAutoGen15Private::_freeAttributes__ymag);
functionMap[HASH_ELEMENT_ZFAR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__zfar, &ColladaParserAutoGen15Private::_data__zfar, &ColladaParserAutoGen15Private::_end__zfar, &ColladaParserAutoGen15Private::_preBegin__zfar, &ColladaParserAutoGen15Private::_preEnd__zfar, &ColladaParserAutoGen15Private::_freeAttributes__zfar);
functionMap[HASH_ELEMENT_ZNEAR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__znear, &ColladaParserAutoGen15Private::_data__znear, &ColladaParserAutoGen15Private::_end__znear, &ColladaParserAutoGen15Private::_preBegin__znear, &ColladaParserAutoGen15Private::_preEnd__znear, &ColladaParserAutoGen15Private::_freeAttributes__znear);
functionMap[HASH_ELEMENT_ASPECT_RATIO] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__aspect_ratio, &ColladaParserAutoGen15Private::_data__aspect_ratio, &ColladaParserAutoGen15Private::_end__aspect_ratio, &ColladaParserAutoGen15Private::_preBegin__aspect_ratio, &ColladaParserAutoGen15Private::_preEnd__aspect_ratio, &ColladaParserAutoGen15Private::_freeAttributes__aspect_ratio);
functionMap[HASH_ELEMENT_XFOV] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__xfov, &ColladaParserAutoGen15Private::_data__xfov, &ColladaParserAutoGen15Private::_end__xfov, &ColladaParserAutoGen15Private::_preBegin__xfov, &ColladaParserAutoGen15Private::_preEnd__xfov, &ColladaParserAutoGen15Private::_freeAttributes__xfov);
functionMap[HASH_ELEMENT_YFOV] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__yfov, &ColladaParserAutoGen15Private::_data__yfov, &ColladaParserAutoGen15Private::_end__yfov, &ColladaParserAutoGen15Private::_preBegin__yfov, &ColladaParserAutoGen15Private::_preEnd__yfov, &ColladaParserAutoGen15Private::_freeAttributes__yfov);
functionMap[HASH_ELEMENT_ZFAR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__zfar, &ColladaParserAutoGen15Private::_data__zfar, &ColladaParserAutoGen15Private::_end__zfar, &ColladaParserAutoGen15Private::_preBegin__zfar, &ColladaParserAutoGen15Private::_preEnd__zfar, &ColladaParserAutoGen15Private::_freeAttributes__zfar);
functionMap[HASH_ELEMENT_ZNEAR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__znear, &ColladaParserAutoGen15Private::_data__znear, &ColladaParserAutoGen15Private::_end__znear, &ColladaParserAutoGen15Private::_preBegin__znear, &ColladaParserAutoGen15Private::_preEnd__znear, &ColladaParserAutoGen15Private::_freeAttributes__znear);
mapFilled = true;
}
return functionMap;
}